

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O0

bool cmSubdirCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  bool bVar3;
  cmMakefile *this;
  string *psVar4;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string binPath_1;
  undefined1 local_e0 [8];
  string binPath;
  undefined1 local_a0 [8];
  string srcPath;
  string *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmMakefile *mf;
  bool excludeFromAll;
  bool res;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  pcVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = false;
  }
  else {
    bVar2 = true;
    mf._2_1_ = false;
    this = cmExecutionStatus::GetMakefile(local_20);
    pcVar1 = status_local;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pcVar1);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), args_local._7_1_ = bVar2, bVar3) {
      srcPath.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              srcPath.field_2._8_8_,"EXCLUDE_FROM_ALL");
      if (bVar3) {
        mf._2_1_ = true;
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )srcPath.field_2._8_8_,"PREORDER");
        if (!bVar3) {
          psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&binPath.field_2 + 8);
          std::operator+(__return_storage_ptr__,psVar4,"/");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a0,__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         srcPath.field_2._8_8_);
          std::__cxx11::string::~string((string *)(binPath.field_2._M_local_buf + 8));
          bVar3 = cmsys::SystemTools::FileIsDirectory((string *)local_a0);
          if (bVar3) {
            psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&binPath_1.field_2 + 8),psVar4,"/");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&binPath_1.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           srcPath.field_2._8_8_);
            std::__cxx11::string::~string((string *)(binPath_1.field_2._M_local_buf + 8));
            cmMakefile::AddSubDirectory
                      (this,(string *)local_a0,(string *)local_e0,mf._2_1_,false,false);
            std::__cxx11::string::~string((string *)local_e0);
          }
          else {
            bVar3 = cmsys::SystemTools::FileIsDirectory((string *)srcPath.field_2._8_8_);
            pcVar1 = local_20;
            if (bVar3) {
              psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
              std::operator+(&local_140,psVar4,"/");
              cmsys::SystemTools::GetFilenameName(&local_160,(string *)srcPath.field_2._8_8_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_120,&local_140,&local_160);
              std::__cxx11::string::~string((string *)&local_160);
              std::__cxx11::string::~string((string *)&local_140);
              cmMakefile::AddSubDirectory
                        (this,(string *)srcPath.field_2._8_8_,(string *)local_120,mf._2_1_,false,
                         false);
              std::__cxx11::string::~string((string *)local_120);
            }
            else {
              cmStrCat<char_const(&)[39],std::__cxx11::string_const&,char_const(&)[17]>
                        (&local_180,(char (*) [39])"Incorrect SUBDIRS command. Directory: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         srcPath.field_2._8_8_,(char (*) [17])0x1057a8a);
              cmExecutionStatus::SetError(pcVar1,&local_180);
              std::__cxx11::string::~string((string *)&local_180);
              bVar2 = false;
            }
          }
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return args_local._7_1_;
}

Assistant:

bool cmSubdirCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;
  cmMakefile& mf = status.GetMakefile();

  for (std::string const& i : args) {
    if (i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath = mf.GetCurrentSourceDirectory() + "/" + i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" + i;
      mf.AddSubDirectory(srcPath, binPath, excludeFromAll, false, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" +
        cmSystemTools::GetFilenameName(i);
      mf.AddSubDirectory(i, binPath, excludeFromAll, false, false);
    } else {
      status.SetError(cmStrCat("Incorrect SUBDIRS command. Directory: ", i,
                               " does not exist."));
      res = false;
    }
  }
  return res;
}